

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O2

SymbolTableRes * constructSymbolTable(SymbolTableRes *__return_storage_ptr__,CProgram *program)

{
  CConstructSymbolTableVisitor symbol_table_visitor;
  undefined1 local_70 [88];
  
  CConstructSymbolTableVisitor::CConstructSymbolTableVisitor
            ((CConstructSymbolTableVisitor *)(local_70 + 0x18));
  (**(program->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)
            (program,(CConstructSymbolTableVisitor *)(local_70 + 0x18));
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CConstructSymbolTableVisitor::GetSymbolTable((CConstructSymbolTableVisitor *)local_70);
  std::__shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             (__shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  CConstructSymbolTableVisitor::GetErrors
            ((vector<CError,_std::allocator<CError>_> *)local_70,
             (CConstructSymbolTableVisitor *)(local_70 + 0x18));
  std::vector<CError,_std::allocator<CError>_>::_M_move_assign
            (&__return_storage_ptr__->errors,(vector<CError,_std::allocator<CError>_> *)local_70);
  std::vector<CError,_std::allocator<CError>_>::~vector
            ((vector<CError,_std::allocator<CError>_> *)local_70);
  CConstructSymbolTableVisitor::~CConstructSymbolTableVisitor
            ((CConstructSymbolTableVisitor *)(local_70 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

SymbolTableRes constructSymbolTable( CProgram *program ) {
    CConstructSymbolTableVisitor symbol_table_visitor = CConstructSymbolTableVisitor( );
    program->Accept( symbol_table_visitor );

    SymbolTableRes res;
    res.symbolTable = symbol_table_visitor.GetSymbolTable( );
    res.errors = symbol_table_visitor.GetErrors( );

    return res;
}